

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_setlocal(lua_State *L)

{
  int iVar1;
  lua_Debug *L_00;
  TValue *ar_00;
  lua_State *in_RDI;
  TValue *tv;
  lua_Debug ar;
  lua_State *L1;
  int arg;
  undefined8 in_stack_ffffffffffffff38;
  int narg;
  lua_State *in_stack_ffffffffffffff40;
  lua_Debug *ar_01;
  undefined8 in_stack_ffffffffffffff50;
  lua_State *in_stack_ffffffffffffff58;
  int local_24;
  undefined8 local_20;
  TValue *local_18;
  TValue *local_10;
  lua_Debug *local_8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_20 = in_RDI;
  L_00 = (lua_Debug *)getthread(in_RDI,&local_24);
  ar_01 = L_00;
  lj_lib_checkint((lua_State *)L_00,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  iVar1 = lua_getstack(in_stack_ffffffffffffff58,iVar1,ar_01);
  narg = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if (iVar1 == 0) {
    lj_err_arg(in_stack_ffffffffffffff40,narg,(ErrMsg)in_stack_ffffffffffffff38);
  }
  ar_00 = lj_lib_checkany(in_stack_ffffffffffffff40,narg);
  local_10 = (TValue *)L_00->what;
  L_00->what = (char *)(local_10 + 1);
  *local_10 = *ar_00;
  local_18 = ar_00;
  local_8 = L_00;
  lj_lib_checkint((lua_State *)ar_01,local_20._4_4_);
  lua_setlocal(in_stack_ffffffffffffff58,(lua_Debug *)&ar_00->field_2,(int)((ulong)ar_01 >> 0x20));
  lua_pushstring(in_stack_ffffffffffffff58,(char *)&ar_00->u64);
  return 1;
}

Assistant:

LJLIB_CF(debug_setlocal)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  TValue *tv;
  if (!lua_getstack(L1, lj_lib_checkint(L, arg+1), &ar))
    lj_err_arg(L, arg+1, LJ_ERR_LVLRNG);
  tv = lj_lib_checkany(L, arg+3);
  copyTV(L1, L1->top++, tv);
  lua_pushstring(L, lua_setlocal(L1, &ar, lj_lib_checkint(L, arg+2)));
  return 1;
}